

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostref.c
# Opt level: O1

wasm_ref_t * call_i_r(wasm_func_t *func,int32_t i)

{
  long lVar1;
  wasm_val_t rs [1];
  wasm_val_t vs [1];
  wasm_val_vec_t results;
  wasm_val_vec_t args;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [8];
  int32_t local_40;
  undefined8 local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  
  printf("call_i_r... ");
  fflush(_stdout);
  local_18 = local_48;
  local_48[0] = 0;
  local_58 = 0x80;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  local_20 = 1;
  local_30 = 1;
  local_40 = i;
  local_28 = (undefined1 *)&local_58;
  lVar1 = wasm_func_call(func);
  if (lVar1 == 0) {
    puts("okay");
    return (wasm_ref_t *)CONCAT44(uStack_4c,uStack_50);
  }
  puts("> Error calling function!");
  exit(1);
}

Assistant:

own wasm_ref_t* call_i_r(const wasm_func_t* func, int32_t i) {
  printf("call_i_r... "); fflush(stdout);
  wasm_val_t vs[1] = { WASM_I32_VAL(i) };
  wasm_val_t rs[1] = { WASM_INIT_VAL };
  wasm_val_vec_t args = WASM_ARRAY_VEC(vs);
  wasm_val_vec_t results = WASM_ARRAY_VEC(rs);
  if (wasm_func_call(func, &args, &results)) {
    printf("> Error calling function!\n");
    exit(1);
  }
  printf("okay\n");
  return rs[0].of.ref;
}